

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O0

void __thiscall
StreamReplacer::provideStreamData(StreamReplacer *this,QPDFObjGen *og,Pipeline *pipeline)

{
  bool bVar1;
  mapped_type *pmVar2;
  logic_error *this_00;
  undefined1 local_30 [8];
  QPDFObjectHandle orig;
  Pipeline *pipeline_local;
  QPDFObjGen *og_local;
  StreamReplacer *this_local;
  
  orig.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pipeline;
  pmVar2 = std::
           map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
           ::operator[](&this->copied_streams,og);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_30,pmVar2);
  bVar1 = maybeReplace(this,*og,(QPDFObjectHandle *)local_30,
                       (Pipeline *)
                       orig.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                       (QPDFObjectHandle *)0x0);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"should_replace return false in provideStreamData");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return;
}

Assistant:

void
StreamReplacer::provideStreamData(QPDFObjGen const& og, Pipeline* pipeline)
{
    QPDFObjectHandle orig = this->copied_streams[og];
    // call maybeReplace again, this time with the pipeline and no dict_updates. In this mode,
    // maybeReplace doesn't make any changes. We have to hand it the original stream data, which we
    // get from copied_streams.
    if (!maybeReplace(og, orig, pipeline, nullptr)) {
        // Since this only gets called for streams we already determined we are replacing, a false
        // return would indicate a logic error.
        throw std::logic_error("should_replace return false in provideStreamData");
    }
}